

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebug::putTimeUnit(QDebug *this,qint64 num,qint64 den)

{
  long lVar1;
  Stream *this_00;
  long lVar2;
  size_t sVar3;
  char cVar4;
  ulong uVar5;
  size_t sVar6;
  qsizetype size;
  char *__s;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<char> QStack_98;
  anon_class_16_2_441c46e7 local_80;
  size_t local_70;
  char buf [50];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->stream;
  if (den < 2 || num != 1) {
    bVar7 = den == 1;
    if (bVar7 && 1 < num) {
      uVar5 = (ulong)num / 0x1e18558;
      if ((ulong)num % 0x1e18558 == 0) {
        __s = "yr";
LAB_00210110:
        bVar7 = true;
        num = uVar5;
        goto LAB_00210113;
      }
      uVar5 = (ulong)num / 0x93a80;
      if ((ulong)num % 0x93a80 == 0) {
        __s = "wk";
        goto LAB_00210110;
      }
      uVar5 = (ulong)num / 0x15180;
      if ((ulong)num % 0x15180 == 0) {
        __s = "d";
        goto LAB_00210110;
      }
      uVar5 = (ulong)num / 0xe10;
      if ((ulong)num % 0xe10 == 0) {
        __s = "h";
        goto LAB_00210110;
      }
      uVar5 = (ulong)num / 0x3c;
      bVar7 = true;
      if ((ulong)num % 0x3c == 0) {
        __s = "min";
        goto LAB_00210110;
      }
      __s = "s";
    }
    else {
      __s = "s";
LAB_00210113:
      if (!(bool)(bVar7 ^ 1U | num != 1U)) {
        size = -1;
        goto LAB_002101f1;
      }
    }
LAB_00210131:
    if ((den < 1) || (num < 1)) {
      QString::asprintf((char **)buf,"<invalid time unit %lld/%lld>",num,den);
      QString::toLatin1_helper_inplace((QByteArray *)&QStack_98,(QString *)buf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
      goto LAB_002101f6;
    }
    local_80.buf = &buf;
    buf._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    buf._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    buf._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    buf._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    buf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    buf[0x30] = -0x56;
    buf[0x31] = -0x56;
    local_80.len = &local_70;
    local_70 = 1;
    buf[0] = '[';
    buf[1] = -0x56;
    buf[2] = -0x56;
    buf[3] = -0x56;
    buf[4] = -0x56;
    buf[5] = -0x56;
    buf[6] = -0x56;
    buf[7] = -0x56;
    timeUnit::anon_class_16_2_441c46e7::operator()(&local_80,num);
    if (!bVar7) {
      buf[local_70] = '/';
      local_70 = local_70 + 1;
      timeUnit::anon_class_16_2_441c46e7::operator()(&local_80,den);
    }
    sVar3 = local_70;
    lVar2 = local_70 + 1;
    buf[local_70] = ']';
    local_70 = local_70 + 1;
    sVar6 = strlen(__s);
    memcpy(buf + lVar2,__s,sVar6);
    sVar6 = strlen(__s);
    size = sVar6 + sVar3 + 1;
    __s = buf;
  }
  else {
    if (den == 10) {
      cVar4 = 'd';
    }
    else if (den == 100) {
      cVar4 = 'c';
    }
    else if (den == 1000) {
      cVar4 = 'm';
    }
    else if (den == 1000000000000000000) {
      cVar4 = 'a';
    }
    else if (den == 1000000000) {
      cVar4 = 'n';
    }
    else if (den == 1000000000000) {
      cVar4 = 'p';
    }
    else if (den == 1000000000000000) {
      cVar4 = 'f';
    }
    else {
      if (den != 1000000) {
        num = 1;
        __s = "s";
        bVar7 = false;
        goto LAB_00210131;
      }
      cVar4 = 'u';
    }
    __s = buf;
    buf[1] = 's';
    buf[2] = '\0';
    buf[0] = cVar4;
    size = 2;
  }
LAB_002101f1:
  QByteArray::QByteArray((QByteArray *)&QStack_98,__s,size);
LAB_002101f6:
  QTextStream::operator<<(&this_00->ts,(QByteArray *)&QStack_98);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putTimeUnit(qint64 num, qint64 den)
{
    stream->ts << timeUnit(num, den); // ### optimize
}